

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

void __thiscall
duckdb::SingleFileBlockManager::MarkBlockAsUsed(SingleFileBlockManager *this,block_id_t block_id)

{
  block_id_t *__v;
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  long lVar4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<long>,_std::_Rb_tree_iterator<long>_> pVar6;
  block_id_t local_28;
  
  local_28 = block_id;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->block_lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  __v = &this->max_block;
  lVar4 = this->max_block;
  if (block_id < lVar4) {
    p_Var3 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 != (_Base_ptr)0x0) {
      p_Var1 = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      do {
        if (block_id <= *(long *)(p_Var3 + 1)) {
          p_Var5 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[*(long *)(p_Var3 + 1) < block_id];
      } while (p_Var3 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(long *)(p_Var5 + 1) <= block_id)) {
        pVar6 = ::std::
                _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
                equal_range(&(this->free_list)._M_t,&local_28);
        ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        _M_erase_aux(&(this->free_list)._M_t,(_Base_ptr)pVar6.first._M_node,
                     (_Base_ptr)pVar6.second._M_node);
        pVar6 = ::std::
                _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
                equal_range(&(this->newly_freed_list)._M_t,&local_28);
        ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        _M_erase_aux(&(this->newly_freed_list)._M_t,(_Base_ptr)pVar6.first._M_node,
                     (_Base_ptr)pVar6.second._M_node);
        goto LAB_01131486;
      }
    }
    IncreaseBlockReferenceCountInternal(this,block_id);
  }
  else {
    if (lVar4 < block_id) {
      do {
        ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   &this->free_list,__v);
        lVar4 = *__v + 1;
        *__v = lVar4;
      } while (lVar4 < block_id);
    }
    *__v = lVar4 + 1;
  }
LAB_01131486:
  pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
  return;
}

Assistant:

void SingleFileBlockManager::MarkBlockAsUsed(block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	D_ASSERT(block_id >= 0);
	if (max_block <= block_id) {
		// the block is past the current max_block
		// in this case we need to increment  "max_block" to "block_id"
		// any blocks in the middle are added to the free list
		// i.e. if max_block = 0, and block_id = 3, we need to add blocks 1 and 2 to the free list
		while (max_block < block_id) {
			free_list.insert(max_block);
			max_block++;
		}
		max_block++;
	} else if (free_list.find(block_id) != free_list.end()) {
		// block is currently in the free list - erase
		free_list.erase(block_id);
		newly_freed_list.erase(block_id);
	} else {
		// block is already in use - increase reference count
		IncreaseBlockReferenceCountInternal(block_id);
	}
}